

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_hash_set.c
# Opt level: O3

void ** TIFFHashSetFindPtr(TIFFHashSet *set,void *elt)

{
  TIFFList *pTVar1;
  _Bool _Var2;
  unsigned_long uVar3;
  
  uVar3 = (*set->fnHashFunc)(elt);
  pTVar1 = set->tabList[uVar3 % (ulong)(long)set->nAllocatedSize];
  while( true ) {
    if (pTVar1 == (TIFFList *)0x0) {
      return (void **)0x0;
    }
    _Var2 = (*set->fnEqualFunc)(pTVar1->pData,elt);
    if (_Var2) break;
    pTVar1 = pTVar1->psNext;
  }
  return &pTVar1->pData;
}

Assistant:

static void **TIFFHashSetFindPtr(TIFFHashSet *set, const void *elt)
{
    const unsigned long nHashVal = set->fnHashFunc(elt) % set->nAllocatedSize;
    TIFFList *cur = set->tabList[nHashVal];
    while (cur)
    {
        if (set->fnEqualFunc(cur->pData, elt))
            return &cur->pData;
        cur = cur->psNext;
    }
    return NULL;
}